

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O3

bool __thiscall WndRect::keepOnScreen(WndRect *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  WndRect screen;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  XPLMGetScreenBoundsGlobal(&local_28,(long)&local_28 + 4,&uStack_20,(long)&uStack_20 + 4);
  iVar4 = (this->tl).x;
  iVar3 = (this->br).x;
  bVar1 = (int)uStack_20 < iVar3;
  if ((int)uStack_20 < iVar3) {
    iVar4 = iVar4 + ((int)uStack_20 - iVar3);
    (this->tl).x = iVar4;
    (this->br).x = (int)uStack_20;
    iVar3 = (int)uStack_20;
  }
  iVar7 = (int)local_28 - iVar4;
  if (iVar7 != 0 && iVar4 <= (int)local_28) {
    (this->tl).x = (int)local_28;
    (this->br).x = iVar7 + iVar3;
  }
  iVar3 = (this->br).y;
  iVar5 = uStack_20._4_4_ - iVar3;
  bVar2 = uStack_20._4_4_ < iVar3;
  if (iVar5 == 0 || bVar2) {
    iVar6 = (this->tl).y;
  }
  else {
    iVar6 = iVar5 + (this->tl).y;
    (this->tl).y = iVar6;
    (this->br).y = uStack_20._4_4_;
    iVar3 = uStack_20._4_4_;
  }
  local_28._4_4_ = local_28._4_4_ + -0x32;
  if (local_28._4_4_ < iVar6) {
    (this->tl).y = local_28._4_4_;
    (this->br).y = (local_28._4_4_ - iVar6) + iVar3;
  }
  return local_28._4_4_ < iVar6 ||
         (iVar5 != 0 && !bVar2 || (iVar7 != 0 && iVar4 <= (int)local_28 || bVar1));
}

Assistant:

bool WndRect::keepOnScreen ()
{
    bool bChanged = false;
    WndRect screen;
    XPLMGetScreenBoundsGlobal(&screen.left(), &screen.top(),
                              &screen.right(), &screen.bottom());


    if (right() > screen.right()) {
        shift(screen.right() - right(), 0);
        bChanged = true;
    }
    if (left() < screen.left()) {
        shift(screen.left() - left(), 0);
        bChanged = true;
    }
    if (bottom() < screen.bottom()) {
        shift(0, screen.bottom() - bottom());
        bChanged = true;
    }
    if (top() > screen.top() - WIN_FROM_TOP) {
        shift(0, screen.top() - WIN_FROM_TOP - top());
        bChanged = true;
    }
    // Did we change any value?
    return bChanged;
}